

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

QMetaMethod __thiscall
QMetaObjectPrivate::firstMethod
          (QMetaObjectPrivate *this,QMetaObject *baseObject,QByteArrayView name)

{
  uint uVar1;
  int iVar2;
  QMetaObjectPrivate *pQVar3;
  Data DVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QMetaMethod QVar8;
  QByteArray local_60;
  QMetaMethod local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this == (QMetaObjectPrivate *)0x0) {
    pQVar3 = (QMetaObjectPrivate *)0x0;
    DVar4.d = (uint *)0x0;
  }
  else {
    do {
      uVar1 = *(uint *)(*(long *)&this->methodCount + 0x10);
      iVar5 = uVar1 + 1;
      uVar6 = (ulong)uVar1 * 6;
      while( true ) {
        uVar6 = uVar6 - 6;
        iVar5 = iVar5 + -1;
        if (iVar5 < 1) break;
        local_48.data.d =
             (uint *)(*(long *)&this->methodCount +
                      (long)*(int *)(*(long *)&this->methodCount + 0x14) * 4 +
                     (uVar6 & 0xffffffff) * 4);
        local_48.mobj = (QMetaObject *)this;
        QMetaMethod::name(&local_60,&local_48);
        bVar7 = (QMetaObject *)local_60.d.size == baseObject;
        if (bVar7 && baseObject != (QMetaObject *)0x0) {
          iVar2 = bcmp((void *)name.m_size,local_60.d.ptr,(size_t)baseObject);
          bVar7 = iVar2 == 0;
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
          }
        }
        pQVar3 = (QMetaObjectPrivate *)local_48.mobj;
        DVar4.d = local_48.data.d;
        if (bVar7) goto LAB_0027f4e0;
      }
      this = *(QMetaObjectPrivate **)this;
    } while (this != (QMetaObjectPrivate *)0x0);
    pQVar3 = (QMetaObjectPrivate *)0x0;
    DVar4.d = (uint *)0x0;
  }
LAB_0027f4e0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar8.data.d = DVar4.d;
  QVar8.mobj = (QMetaObject *)pQVar3;
  return QVar8;
}

Assistant:

QMetaMethod QMetaObjectPrivate::firstMethod(const QMetaObject *baseObject, QByteArrayView name)
{
    for (const QMetaObject *currentObject = baseObject; currentObject; currentObject = currentObject->superClass()) {
        const int start = priv(currentObject->d.data)->methodCount - 1;
        const int end = 0;
        for (int i = start; i >= end; --i) {
            auto candidate = QMetaMethod::fromRelativeMethodIndex(currentObject, i);
            if (name == candidate.name())
                return candidate;
        }
    }
    return QMetaMethod{};
}